

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_row(REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_DBL *N)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT point;
  REF_INT i;
  REF_DBL n [16];
  REF_INT span;
  REF_DBL *N_local;
  REF_DBL t_local;
  REF_DBL *knots_local;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  if (degree < 0x10) {
    n_control_point_local =
         ref_geom_bspline_span_index(degree,n_control_point,knots,t,(REF_INT *)((long)n + 0x7c));
    if (n_control_point_local == 0) {
      n_control_point_local = ref_geom_bspline_basis(degree,knots,t,n[0xf]._4_4_,(REF_DBL *)&point);
      if (n_control_point_local == 0) {
        for (verbose = 0; verbose < n_control_point; verbose = verbose + 1) {
          N[verbose] = 0.0;
        }
        for (verbose = 0; verbose < degree + 1; verbose = verbose + 1) {
          N[(n[0xf]._4_4_ - degree) + verbose] = *(REF_DBL *)(&point + (long)verbose * 2);
        }
        n_control_point_local = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x10b4,"ref_geom_bspline_row",(ulong)(uint)n_control_point_local,"basis");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10b2
             ,"ref_geom_bspline_row",(ulong)(uint)n_control_point_local,"index");
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10b0,
           "ref_geom_bspline_row","temp variables sized smaller than degree");
    n_control_point_local = 1;
  }
  return n_control_point_local;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_row(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *knots, REF_DBL t, REF_DBL *N) {
  REF_INT span;
  REF_DBL n[16];
  REF_INT i, point;
  REF_BOOL verbose = REF_FALSE;
  RAS(degree < 16, "temp variables sized smaller than degree");
  RSS(ref_geom_bspline_span_index(degree, n_control_point, knots, t, &span),
      "index");
  if (verbose) printf("deg %d ncp %d span %d :", degree, n_control_point, span);
  RSS(ref_geom_bspline_basis(degree, knots, t, span, n), "basis");
  for (i = 0; i < n_control_point; i++) {
    N[i] = 0.0;
  }
  for (i = 0; i < degree + 1; i++) {
    point = span - degree + i;
    N[point] = n[i];
  }

  if (verbose) {
    for (i = 0; i < n_control_point; i++) {
      printf(" %f", N[i]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}